

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error TT_Set_Named_Instance(TT_Face face,FT_UInt instance_index)

{
  byte *pbVar1;
  FT_MM_Var *pFVar2;
  FT_Var_Named_Style *pFVar3;
  int iVar4;
  FT_Error FVar5;
  FT_Error FVar6;
  GX_Blend pGVar7;
  FT_String *local_40;
  FT_String *style_name;
  
  pGVar7 = face->blend;
  FVar5 = 6;
  if (pGVar7 == (GX_Blend)0x0) {
    FVar5 = 0;
    FVar6 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (FVar6 != 0) {
      return FVar6;
    }
    pGVar7 = face->blend;
  }
  if (*(ushort *)((long)&(face->root).style_flags + 2) < instance_index) {
    return FVar5;
  }
  if (instance_index != 0) {
    pFVar2 = pGVar7->mmvar;
    pFVar3 = pFVar2->namedstyle;
    if (pFVar3 != (FT_Var_Named_Style *)0x0) {
      style_name = (FT_String *)(face->root).memory;
      iVar4 = (**(code **)((long)face->sfnt + 0xe8))
                        (face,(short)pFVar3[(ulong)instance_index - 1].strid,&local_40);
      if (iVar4 != 0) {
        return iVar4;
      }
      ft_mem_free((FT_Memory)style_name,(face->root).style_name);
      (face->root).style_name = local_40;
      FVar5 = TT_Set_Var_Design(face,pFVar2->num_axis,pFVar3[(ulong)instance_index - 1].coords);
      if (FVar5 != 0) {
        return FVar5;
      }
      FVar5 = 0;
      goto LAB_00227b76;
    }
  }
  FVar5 = TT_Set_Var_Design(face,0,(FT_Fixed *)0x0);
LAB_00227b76:
  (face->root).face_index = (ulong)(ushort)(face->root).face_index | (ulong)(instance_index << 0x10)
  ;
  pbVar1 = (byte *)((long)&(face->root).face_flags + 1);
  *pbVar1 = *pbVar1 & 0x7f;
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Set_Named_Instance( TT_Face  face,
                         FT_UInt  instance_index )
  {
    FT_Error    error = FT_ERR( Invalid_Argument );
    GX_Blend    blend;
    FT_MM_Var*  mmvar;

    FT_UInt  num_instances;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    num_instances = (FT_UInt)face->root.style_flags >> 16;

    /* `instance_index' starts with value 1, thus `>' */
    if ( instance_index > num_instances )
      goto Exit;

    if ( instance_index > 0 && mmvar->namedstyle )
    {
      FT_Memory     memory = face->root.memory;
      SFNT_Service  sfnt   = (SFNT_Service)face->sfnt;

      FT_Var_Named_Style*  named_style;
      FT_String*           style_name;


      named_style = mmvar->namedstyle + instance_index - 1;

      error = sfnt->get_name( face,
                              (FT_UShort)named_style->strid,
                              &style_name );
      if ( error )
        goto Exit;

      /* set (or replace) style name */
      FT_FREE( face->root.style_name );
      face->root.style_name = style_name;

      /* finally, select the named instance */
      error = TT_Set_Var_Design( face,
                                 mmvar->num_axis,
                                 named_style->coords );
      if ( error )
        goto Exit;
    }
    else
      error = TT_Set_Var_Design( face, 0, NULL );

    face->root.face_index  = ( instance_index << 16 )             |
                             ( face->root.face_index & 0xFFFFL );
    face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

  Exit:
    return error;
  }